

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteBlif.c
# Opt level: O1

void Psr_ManWriteBlifArray(FILE *pFile,Psr_Ntk_t *p,Vec_Int_t *vFanins)

{
  char *pcVar1;
  long lVar2;
  
  if (0 < vFanins->nSize) {
    lVar2 = 0;
    do {
      pcVar1 = Abc_NamStr(p->pStrs,vFanins->pArray[lVar2]);
      fprintf((FILE *)pFile," %s",pcVar1);
      lVar2 = lVar2 + 1;
    } while (lVar2 < vFanins->nSize);
  }
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Writing parser state into a file.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
static void Psr_ManWriteBlifArray( FILE * pFile, Psr_Ntk_t * p, Vec_Int_t * vFanins )
{
    int i, NameId;
    Vec_IntForEachEntry( vFanins, NameId, i )
        fprintf( pFile, " %s", Psr_NtkStr(p, NameId) );
    fprintf( pFile, "\n" );
}